

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entities.c
# Opt level: O1

xmlEntityPtr
xmlNewEntity(xmlDocPtr doc,xmlChar *name,int type,xmlChar *ExternalID,xmlChar *SystemID,
            xmlChar *content)

{
  xmlEntityPtr pxVar1;
  xmlEntityPtr local_10;
  
  if ((doc != (xmlDocPtr)0x0) && (doc->intSubset != (_xmlDtd *)0x0)) {
    xmlAddEntity(doc,0,name,type,ExternalID,SystemID,content,&local_10);
    return local_10;
  }
  if (name != (xmlChar *)0x0) {
    pxVar1 = xmlCreateEntity(doc,name,type,ExternalID,SystemID,content);
    return pxVar1;
  }
  return (xmlEntityPtr)0x0;
}

Assistant:

xmlEntityPtr
xmlNewEntity(xmlDocPtr doc, const xmlChar *name, int type,
	     const xmlChar *ExternalID, const xmlChar *SystemID,
	     const xmlChar *content) {
    if ((doc != NULL) && (doc->intSubset != NULL)) {
	return(xmlAddDocEntity(doc, name, type, ExternalID, SystemID, content));
    }
    if (name == NULL)
        return(NULL);
    return(xmlCreateEntity(doc, name, type, ExternalID, SystemID, content));
}